

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2XMLReaderImpl.cpp
# Opt level: O0

void __thiscall xercesc_4_0::SAX2XMLReaderImpl::resolveEntity(SAX2XMLReaderImpl *this)

{
  XMLResourceIdentifier *in_RSI;
  
  resolveEntity((SAX2XMLReaderImpl *)&this[-1].fValidator,in_RSI);
  return;
}

Assistant:

InputSource* SAX2XMLReaderImpl::resolveEntity(XMLResourceIdentifier* resourceIdentifier)
{
    //
    //  Just map it to the SAX entity resolver. If there is not one installed,
    //  return a null pointer to cause the default resolution.
    //
    if (fEntityResolver)
        return fEntityResolver->resolveEntity(resourceIdentifier->getPublicId(),
                                                resourceIdentifier->getSystemId());
    if (fXMLEntityResolver)
        return fXMLEntityResolver->resolveEntity(resourceIdentifier);

    return 0;
}